

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::BaseCompiler::setStackSize
          (BaseCompiler *this,uint32_t virtId,uint32_t newSize,uint32_t newAlignment)

{
  long lVar1;
  long lVar2;
  uint32_t uVar3;
  Error EVar4;
  
  EVar4 = 0x1e;
  if (virtId - 0x100 < *(uint *)&this->field_0x1f0) {
    if ((newAlignment & newAlignment - 1) != 0) {
      EVar4 = BaseEmitter::reportError((BaseEmitter *)this,2,(char *)0x0);
      return EVar4;
    }
    uVar3 = 0x40;
    if (newAlignment < 0x40) {
      uVar3 = newAlignment;
    }
    lVar1 = *(long *)(*(long *)&this->_vRegArray + (ulong)(virtId - 0x100) * 8);
    if (newSize != 0) {
      *(uint32_t *)(lVar1 + 8) = newSize;
    }
    if (newAlignment != 0) {
      *(char *)(lVar1 + 0xc) = (char)uVar3;
    }
    EVar4 = 0;
    if ((*(long *)(lVar1 + 0x28) != 0) &&
       (lVar2 = *(long *)(*(long *)(lVar1 + 0x28) + 0x18), lVar2 != 0)) {
      *(undefined4 *)(lVar2 + 4) = *(undefined4 *)(lVar1 + 8);
      *(undefined1 *)(lVar2 + 1) = *(undefined1 *)(lVar1 + 0xc);
      EVar4 = 0;
    }
  }
  return EVar4;
}

Assistant:

Error BaseCompiler::setStackSize(uint32_t virtId, uint32_t newSize, uint32_t newAlignment) {
  if (!isVirtIdValid(virtId))
    return DebugUtils::errored(kErrorInvalidVirtId);

  if (newAlignment && !Support::isPowerOf2(newAlignment))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (newAlignment > 64)
    newAlignment = 64;

  VirtReg* vReg = virtRegById(virtId);
  if (newSize)
    vReg->_virtSize = newSize;

  if (newAlignment)
    vReg->_alignment = uint8_t(newAlignment);

  // This is required if the RAPass is already running. There is a chance that a stack-slot has been already
  // allocated and in that case it has to be updated as well, otherwise we would allocate wrong amount of memory.
  RAWorkReg* workReg = vReg->_workReg;
  if (workReg && workReg->_stackSlot) {
    workReg->_stackSlot->_size = vReg->_virtSize;
    workReg->_stackSlot->_alignment = vReg->_alignment;
  }

  return kErrorOk;
}